

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall LiteScript::Class::AddUnstatic(Class *this,char *name,Variable *v)

{
  Variable *pVVar1;
  bool bVar2;
  size_type sVar3;
  reference __lhs;
  Variable local_128;
  allocator local_111;
  string local_110 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  *local_c0;
  Variable local_b8 [2];
  allocator local_91;
  string local_90 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_70;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>_>
  local_40;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>_>
  local_38;
  const_iterator local_30;
  uint local_28;
  uint local_24;
  uint sz;
  uint i;
  Variable *v_local;
  char *name_local;
  Class *this_local;
  
  local_24 = 0;
  _sz = v;
  v_local = (Variable *)name;
  name_local = (char *)this;
  sVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::size(&this->us_members);
  local_28 = (uint)sVar3;
  while( true ) {
    pVVar1 = v_local;
    if (local_28 <= local_24) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,(char *)pVVar1,&local_111);
      Variable::Variable(&local_128,_sz);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
                (&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_128);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ::push_back(&this->us_members,&local_f0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::~pair(&local_f0);
      Variable::~Variable(&local_128);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      return;
    }
    __lhs = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
            ::operator[](&this->us_members,(ulong)local_24);
    bVar2 = std::operator==(&__lhs->first,(char *)v_local);
    if (bVar2) break;
    local_24 = local_24 + 1;
  }
  local_40._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::begin(&this->us_members);
  local_38 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>_>
             ::operator+(&local_40,(ulong)local_24);
  __gnu_cxx::
  __normal_iterator<std::pair<std::__cxx11::string,LiteScript::Variable>const*,std::vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>>
  ::__normal_iterator<std::pair<std::__cxx11::string,LiteScript::Variable>*>
            ((__normal_iterator<std::pair<std::__cxx11::string,LiteScript::Variable>const*,std::vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>>
              *)&local_30,&local_38);
  pVVar1 = v_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)pVVar1,&local_91);
  Variable::Variable(local_b8,_sz);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
             ,local_b8);
  local_c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
              *)std::
                vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
                ::emplace<std::pair<std::__cxx11::string,LiteScript::Variable>>
                          ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
                            *)&this->us_members,local_30,&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::~pair(&local_70);
  Variable::~Variable(local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

void LiteScript::Class::AddUnstatic(const char *name, const Variable &v) {
    for (unsigned int i = 0, sz = this->us_members.size(); i < sz; i++) {
        if (this->us_members[i].first == name) {
            this->us_members.emplace(this->us_members.begin() + i, std::pair<std::string, Variable>({ std::string(name), Variable(v) }));
            return;
        }
    }
    this->us_members.push_back({ std::string(name), Variable(v) });
}